

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O2

void png_handle_iTXt(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  png_bytep buf;
  ulong uVar4;
  uint uVar5;
  png_uint_32 pVar6;
  char *pcVar8;
  ulong uVar9;
  png_alloc_size_t local_70;
  png_text text;
  ulong uVar7;
  
  pVar6 = png_ptr->user_chunk_cache_max;
  if (pVar6 != 0) {
    if (pVar6 == 1) {
      png_crc_finish(png_ptr,length);
      return;
    }
    png_ptr->user_chunk_cache_max = pVar6 - 1;
    if (pVar6 - 1 == 1) {
      png_crc_finish(png_ptr,length);
      pcVar8 = "no space in chunk cache";
      goto LAB_00285774;
    }
  }
  uVar5 = png_ptr->mode;
  if ((uVar5 & 1) == 0) {
    png_chunk_error(png_ptr,"missing IHDR");
  }
  if ((uVar5 & 4) != 0) {
    png_ptr->mode = uVar5 | 8;
  }
  buf = png_read_buffer(png_ptr,(ulong)(length + 1),1);
  if (buf == (png_bytep)0x0) {
    png_crc_finish(png_ptr,length);
    pcVar8 = "out of memory";
LAB_00285774:
    png_chunk_benign_error(png_ptr,pcVar8);
    return;
  }
  png_crc_read(png_ptr,buf,length);
  iVar2 = png_crc_finish(png_ptr,0);
  if (iVar2 != 0) {
    return;
  }
  uVar4 = (ulong)length;
  for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
    if (buf[uVar9] == '\0') goto LAB_0028578d;
  }
  uVar9 = (ulong)length;
LAB_0028578d:
  iVar2 = (int)uVar9;
  if (iVar2 - 0x50U < 0xffffffb1) {
    pcVar8 = "bad keyword";
  }
  else if (length < iVar2 + 5U) {
    pcVar8 = "truncated";
  }
  else {
    bVar1 = buf[(uVar9 & 0xffffffff) + 1];
    if ((bVar1 == 0) ||
       ((pcVar8 = "bad compression info", bVar1 == 1 && (buf[(uVar9 & 0xffffffff) + 2] == '\0')))) {
      for (uVar9 = (ulong)(iVar2 + 3); uVar9 < uVar4; uVar9 = uVar9 + 1) {
        if (buf[uVar9] == '\0') goto LAB_002857fd;
      }
      uVar9 = (ulong)length;
LAB_002857fd:
      pVar6 = (int)uVar9 + 1;
      uVar7 = (ulong)pVar6;
      uVar9 = uVar7;
      if (pVar6 < length) {
        pVar6 = length;
      }
      for (; uVar9 < uVar4; uVar9 = uVar9 + 1) {
        if (buf[uVar9] == '\0') {
          pVar6 = (png_uint_32)uVar9;
          break;
        }
      }
      uVar5 = pVar6 + 1;
      if ((bVar1 != 0) || (uVar4 = (ulong)(length - uVar5), length < uVar5)) {
        pcVar8 = "truncated";
        if ((bVar1 == 0) || (length <= uVar5)) goto LAB_002858ed;
        local_70 = 0xffffffffffffffff;
        iVar3 = png_decompress_chunk(png_ptr,length,uVar5,&local_70,(uint)bVar1);
        uVar4 = local_70;
        if (iVar3 == 1) {
          buf = png_ptr->read_buffer;
        }
        else {
          pcVar8 = (png_ptr->zstream).msg;
          if (pcVar8 != (png_const_charp)0x0) goto LAB_002858ed;
        }
      }
      local_70 = uVar4;
      buf[local_70 + uVar5] = '\0';
      text.compression = 2 - (uint)(bVar1 == 0);
      text.lang = (png_charp)(buf + (iVar2 + 3));
      text.lang_key = (png_charp)(buf + uVar7);
      text.text = (png_charp)(buf + uVar5);
      text.text_length = 0;
      text.itxt_length = local_70;
      text.key = (png_charp)buf;
      iVar2 = png_set_text_2(png_ptr,info_ptr,&text,1);
      if (iVar2 == 0) {
        return;
      }
      pcVar8 = "insufficient memory";
    }
  }
LAB_002858ed:
  png_chunk_benign_error(png_ptr,pcVar8);
  return;
}

Assistant:

void /* PRIVATE */
png_handle_iTXt(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_const_charp errmsg = NULL;
   png_bytep buffer;
   png_uint_32 prefix_length;

   png_debug(1, "in png_handle_iTXt");

#ifdef PNG_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_cache_max != 0)
   {
      if (png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         return;
      }

      if (--png_ptr->user_chunk_cache_max == 1)
      {
         png_crc_finish(png_ptr, length);
         png_chunk_benign_error(png_ptr, "no space in chunk cache");
         return;
      }
   }
#endif

   if ((png_ptr->mode & PNG_HAVE_IHDR) == 0)
      png_chunk_error(png_ptr, "missing IHDR");

   if ((png_ptr->mode & PNG_HAVE_IDAT) != 0)
      png_ptr->mode |= PNG_AFTER_IDAT;

   buffer = png_read_buffer(png_ptr, length+1, 1/*warn*/);

   if (buffer == NULL)
   {
      png_crc_finish(png_ptr, length);
      png_chunk_benign_error(png_ptr, "out of memory");
      return;
   }

   png_crc_read(png_ptr, buffer, length);

   if (png_crc_finish(png_ptr, 0) != 0)
      return;

   /* First the keyword. */
   for (prefix_length=0;
      prefix_length < length && buffer[prefix_length] != 0;
      ++prefix_length)
      /* Empty loop */ ;

   /* Perform a basic check on the keyword length here. */
   if (prefix_length > 79 || prefix_length < 1)
      errmsg = "bad keyword";

   /* Expect keyword, compression flag, compression type, language, translated
    * keyword (both may be empty but are 0 terminated) then the text, which may
    * be empty.
    */
   else if (prefix_length + 5 > length)
      errmsg = "truncated";

   else if (buffer[prefix_length+1] == 0 ||
      (buffer[prefix_length+1] == 1 &&
      buffer[prefix_length+2] == PNG_COMPRESSION_TYPE_BASE))
   {
      int compressed = buffer[prefix_length+1] != 0;
      png_uint_32 language_offset, translated_keyword_offset;
      png_alloc_size_t uncompressed_length = 0;

      /* Now the language tag */
      prefix_length += 3;
      language_offset = prefix_length;

      for (; prefix_length < length && buffer[prefix_length] != 0;
         ++prefix_length)
         /* Empty loop */ ;

      /* WARNING: the length may be invalid here, this is checked below. */
      translated_keyword_offset = ++prefix_length;

      for (; prefix_length < length && buffer[prefix_length] != 0;
         ++prefix_length)
         /* Empty loop */ ;

      /* prefix_length should now be at the trailing '\0' of the translated
       * keyword, but it may already be over the end.  None of this arithmetic
       * can overflow because chunks are at most 2^31 bytes long, but on 16-bit
       * systems the available allocation may overflow.
       */
      ++prefix_length;

      if (compressed == 0 && prefix_length <= length)
         uncompressed_length = length - prefix_length;

      else if (compressed != 0 && prefix_length < length)
      {
         uncompressed_length = PNG_SIZE_MAX;

         /* TODO: at present png_decompress_chunk imposes a single application
          * level memory limit, this should be split to different values for
          * iCCP and text chunks.
          */
         if (png_decompress_chunk(png_ptr, length, prefix_length,
             &uncompressed_length, 1/*terminate*/) == Z_STREAM_END)
            buffer = png_ptr->read_buffer;

         else
            errmsg = png_ptr->zstream.msg;
      }

      else
         errmsg = "truncated";

      if (errmsg == NULL)
      {
         png_text text;

         buffer[uncompressed_length+prefix_length] = 0;

         if (compressed == 0)
            text.compression = PNG_ITXT_COMPRESSION_NONE;

         else
            text.compression = PNG_ITXT_COMPRESSION_zTXt;

         text.key = (png_charp)buffer;
         text.lang = (png_charp)buffer + language_offset;
         text.lang_key = (png_charp)buffer + translated_keyword_offset;
         text.text = (png_charp)buffer + prefix_length;
         text.text_length = 0;
         text.itxt_length = uncompressed_length;

         if (png_set_text_2(png_ptr, info_ptr, &text, 1) != 0)
            errmsg = "insufficient memory";
      }
   }

   else
      errmsg = "bad compression info";

   if (errmsg != NULL)
      png_chunk_benign_error(png_ptr, errmsg);
}